

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

cf_void_t cf_list_deinit(cf_list_t *self)

{
  cf_list_node *pcVar1;
  cf_list_t *addr;
  
  addr = self->next;
  while (addr != self) {
    pcVar1 = addr->next;
    cf_free_dbg(addr,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/list.c"
                ,"cf_list_deinit",0x17);
    addr = pcVar1;
  }
  self->data = (cf_void_t *)0x0;
  self->prev = (cf_list_node *)0x0;
  self->next = (cf_list_node *)0x0;
  return;
}

Assistant:

cf_void_t cf_list_deinit(cf_list_t* self) {
    cf_list_iter_t it = CF_NULL_PTR;
    cf_list_node_t* node = CF_NULL_PTR;
    it = cf_list_iter_init(self);
    while(it != self) {
        node = it;
        it = it->next;

        cf_free(node);
    }

    self->prev = self->next = CF_NULL_PTR;
    self->data = 0;
}